

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

bool_t NodeHibernate(anynode *AnyNode)

{
  nodecontext *p;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  
  if (AnyNode == (anynode *)0x0) {
    __assert_fail("(const void*)(AnyNode)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0xb2b,"bool_t NodeHibernate(anynode *)");
  }
  p = (nodecontext *)**(undefined8 **)((long)AnyNode + 8);
  uVar6 = 0;
  if (p->InCollect == 0) {
    p->InCollect = 1;
    bVar1 = false;
    do {
      if (bVar1) break;
      uVar4 = 0x7fffffff;
      if (0xf < (p->Collect)._Used) {
        pcVar5 = (p->Collect)._Begin;
        do {
          uVar2 = (**(code **)pcVar5)(*(undefined8 *)(pcVar5 + 8));
          uVar3 = uVar2;
          if ((int)uVar4 < (int)uVar2) {
            uVar3 = uVar4;
          }
          if ((int)uVar2 <= (int)uVar6) {
            uVar3 = uVar4;
          }
          if (uVar2 == 0xffffffff) {
            bVar1 = true;
            uVar3 = uVar4;
          }
          uVar4 = uVar3;
          pcVar5 = pcVar5 + 0x10;
        } while (pcVar5 != (p->Collect)._Begin + ((p->Collect)._Used & 0xfffffffffffffff0));
      }
      uVar6 = (ulong)uVar4;
    } while (uVar4 != 0x7fffffff);
    uVar6 = 1;
    if (!bVar1) {
      uVar6 = NodeContext_Cleanup(p,0);
    }
    p->InCollect = 0;
  }
  return uVar6;
}

Assistant:

bool_t NodeHibernate(anynode* AnyNode)
{
    nodecontext* p = Node_Context(AnyNode);
    bool_t Changed = 0;

    if (!p->InCollect)
    {
        int Level;
        int NextLevel;
        memcollectitem* i;
        p->InCollect = 1;

        for (Level=COLLECT_UNUSED;!Changed;Level=NextLevel)
        {
            NextLevel = INT_MAX;
            for (i=ARRAYBEGIN(p->Collect,memcollectitem);i!=ARRAYEND(p->Collect,memcollectitem);++i)
            {
                int v=i->Func(i->Cookie,Level);
                if (v==COLLECT_FOUND)
                    Changed=1;
                else
                if (NextLevel>v && v>Level)
                    NextLevel=v;
            }
            if (NextLevel==INT_MAX)
                break;
        }

        if (!Changed && NodeContext_Cleanup(p,0))
            Changed = 1;

        p->InCollect = 0;
    }

    return Changed;
}